

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

lua_Integer luaL_checkinteger(lua_State *L,int arg)

{
  lua_Integer lVar1;
  lua_Integer d;
  int isnum;
  int arg_local;
  lua_State *L_local;
  
  d._4_4_ = arg;
  _isnum = L;
  lVar1 = lua_tointegerx(L,arg,(int *)&d);
  if ((int)d == 0) {
    interror(_isnum,d._4_4_);
  }
  return lVar1;
}

Assistant:

LUALIB_API lua_Integer luaL_checkinteger(lua_State *L, int arg) {
    int isnum;
    lua_Integer d = lua_tointegerx(L, arg, &isnum);
    if (!isnum) {
        interror(L, arg);
    }
    return d;
}